

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O3

void google::SafeAppendHexNumber(uint64_t value,char *dest,size_t dest_size)

{
  undefined1 uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  char *source;
  char buf [17];
  undefined8 local_18;
  undefined8 uStack_10;
  undefined1 local_8;
  
  local_18 = 0;
  uStack_10 = 0;
  local_8 = 0;
  lVar3 = 0;
  do {
    lVar4 = lVar3;
    if (lVar4 == 0x10) {
      local_18 = local_18 & 0xffffffffffffff00;
      source = (char *)0x0;
      goto LAB_00120e36;
    }
    *(char *)((long)&local_18 + lVar4) = "0123456789abcdef"[(uint)value & 0xf];
    bVar2 = 0xf < value;
    lVar3 = lVar4 + 1;
    value = value >> 4;
  } while (bVar2);
  puVar5 = (undefined1 *)((long)&local_18 + lVar4);
  *(undefined1 *)((long)&local_18 + lVar4 + 1) = 0;
  source = (char *)&local_18;
  if (&local_18 < puVar5) {
    puVar6 = (undefined1 *)((long)&local_18 + 1);
    do {
      uVar1 = *puVar5;
      *puVar5 = puVar6[-1];
      puVar6[-1] = uVar1;
      puVar5 = puVar5 + -1;
      bVar2 = puVar6 < puVar5;
      puVar6 = puVar6 + 1;
      source = (char *)&local_18;
    } while (bVar2);
  }
LAB_00120e36:
  SafeAppendString(source,dest,dest_size);
  return;
}

Assistant:

static void SafeAppendHexNumber(uint64_t value, char* dest, size_t dest_size) {
  // 64-bit numbers in hex can have up to 16 digits.
  char buf[17] = {'\0'};
  SafeAppendString(itoa_r(value, buf, sizeof(buf), 16, 0), dest, dest_size);
}